

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cc
# Opt level: O1

void __thiscall tt::net::EventLoopThread::EventLoopThread(EventLoopThread *this)

{
  string local_58;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  this->m_loop = (EventLoop *)0x0;
  this->m_exiting = false;
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_38._M_unused._M_object = operator_new(0x18);
  *(code **)local_38._M_unused._0_8_ = threadFunc;
  *(undefined8 *)((long)local_38._M_unused._0_8_ + 8) = 0;
  *(EventLoopThread **)((long)local_38._M_unused._0_8_ + 0x10) = this;
  pcStack_20 = std::
               _Function_handler<void_(),_std::_Bind<void_(tt::net::EventLoopThread::*(tt::net::EventLoopThread_*))()>_>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_std::_Bind<void_(tt::net::EventLoopThread::*(tt::net::EventLoopThread_*))()>_>
             ::_M_manager;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"EventLoopThread","");
  Thread::Thread(&this->m_thread,(ThreadFunc *)&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  pthread_mutex_init((pthread_mutex_t *)&this->m_mutex,(pthread_mutexattr_t *)0x0);
  (this->m_cond).m_mutex = &this->m_mutex;
  pthread_cond_init((pthread_cond_t *)&(this->m_cond).m_cond,(pthread_condattr_t *)0x0);
  return;
}

Assistant:

EventLoopThread::EventLoopThread()
	:m_loop(NULL),
	m_exiting(false), //是否退出
	m_thread(std::bind(&EventLoopThread::threadFunc,this), "EventLoopThread"),
	m_mutex(),
	m_cond(m_mutex){
	
	
}